

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::RegisterTypeParameterizedTestSuite
               (char *test_suite_name,CodeLocation *code_location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TypeParameterizedTestSuiteRegistry *this;
  CodeLocation local_48;
  
  UnitTest::GetInstance();
  this = &(UnitTest::GetInstance::instance.impl_)->type_parameterized_test_registry_;
  paVar1 = &local_48.file.field_2;
  local_48.file._M_dataplus._M_p = (code_location->file)._M_dataplus._M_p;
  paVar2 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.file._M_dataplus._M_p == paVar2) {
    local_48.file.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_48.file.field_2._8_8_ = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_48.file._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_48.file.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_48.file._M_string_length = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar2;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_48.line = code_location->line;
  TypeParameterizedTestSuiteRegistry::RegisterTestSuite(this,test_suite_name,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.file._M_dataplus._M_p,local_48.file.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RegisterTypeParameterizedTestSuite(const char* test_suite_name,
                                        CodeLocation code_location) {
  GetUnitTestImpl()->type_parameterized_test_registry().RegisterTestSuite(
      test_suite_name, std::move(code_location));
}